

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O1

int Wln_RetComputeFfClasses(Wln_Ntk_t *pNtk,Vec_Int_t *vClasses)

{
  int *piVar1;
  Wln_Vec_t *pWVar2;
  uint uVar3;
  int iVar4;
  uint *__ptr;
  void *pvVar5;
  Vec_Int_t *p;
  int *piVar6;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  uint *puVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  
  uVar11 = 9;
  while( true ) {
    do {
      uVar16 = uVar11;
      uVar11 = uVar16 + 1;
    } while ((uVar16 & 1) != 0);
    if (uVar11 < 9) break;
    iVar8 = 5;
    while (uVar11 % (iVar8 - 2U) != 0) {
      uVar3 = iVar8 * iVar8;
      iVar8 = iVar8 + 2;
      if (uVar11 < uVar3) goto LAB_0036288b;
    }
  }
LAB_0036288b:
  __ptr = (uint *)malloc(0x10);
  uVar3 = 0x10;
  if (0xe < uVar16) {
    uVar3 = uVar11;
  }
  __ptr[1] = 0;
  *__ptr = uVar3;
  pvVar5 = malloc((long)(int)uVar3 << 2);
  *(void **)(__ptr + 2) = pvVar5;
  __ptr[1] = uVar11;
  if (pvVar5 != (void *)0x0) {
    memset(pvVar5,0xff,(long)(int)uVar11 << 2);
  }
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 0x28;
  p->nSize = 0;
  piVar6 = (int *)malloc(0xa0);
  p->pArray = piVar6;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10;
  p_00->nSize = 0;
  piVar6 = (int *)malloc(0x40);
  p_00->pArray = piVar6;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 0x10;
  p_01->nSize = 0;
  piVar6 = (int *)malloc(0x40);
  p_01->pArray = piVar6;
  uVar11 = (pNtk->vTypes).nSize;
  if (vClasses->nCap < (int)uVar11) {
    if (vClasses->pArray == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar11 << 2);
    }
    else {
      piVar6 = (int *)realloc(vClasses->pArray,(long)(int)uVar11 << 2);
    }
    vClasses->pArray = piVar6;
    if (piVar6 == (int *)0x0) {
LAB_00362eb0:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vClasses->nCap = uVar11;
  }
  if (0 < (int)uVar11) {
    memset(vClasses->pArray,0xff,(ulong)uVar11 * 4);
  }
  vClasses->nSize = uVar11;
  if ((pNtk->vFfs).nSize < 1) {
LAB_00362d7c:
    uVar11 = p_00->nSize;
    if (*(void **)(__ptr + 2) != (void *)0x0) {
      free(*(void **)(__ptr + 2));
      __ptr[2] = 0;
      __ptr[3] = 0;
    }
    free(__ptr);
    if (p->pArray != (int *)0x0) {
      free(p->pArray);
      p->pArray = (int *)0x0;
    }
    free(p);
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
      p_00->pArray = (int *)0x0;
    }
    free(p_00);
    if (p_01->pArray != (int *)0x0) {
      free(p_01->pArray);
      p_01->pArray = (int *)0x0;
    }
    free(p_01);
    printf("Detected %d flops and %d flop classes.\n",(ulong)(uint)(pNtk->vFfs).nSize,(ulong)uVar11)
    ;
    return uVar11;
  }
  lVar10 = 0;
  do {
    iVar8 = (pNtk->vFfs).pArray[lVar10];
    p_01->nSize = 0;
    lVar15 = 1;
    lVar12 = 0;
    do {
      pWVar2 = pNtk->vFanins;
      if (pWVar2[iVar8].nSize < 3) {
        piVar6 = (int *)((long)&pWVar2[iVar8].field_2 + lVar12 + 4);
      }
      else {
        piVar6 = pWVar2[iVar8].field_2.pArray[0] + lVar15;
      }
      Vec_IntPush(p_01,*piVar6);
      lVar15 = lVar15 + 1;
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x18);
    if ((int)__ptr[1] < p_00->nSize) {
      uVar13 = (ulong)(__ptr[1] * 2 - 1);
      while( true ) {
        do {
          uVar11 = (uint)uVar13;
          uVar16 = uVar11 + 1;
          uVar17 = (ulong)uVar16;
          uVar14 = uVar13 & 1;
          uVar13 = uVar17;
        } while (uVar14 != 0);
        if (uVar16 < 9) break;
        iVar9 = 5;
        while (uVar16 % (iVar9 - 2U) != 0) {
          uVar3 = iVar9 * iVar9;
          iVar9 = iVar9 + 2;
          if (uVar16 < uVar3) goto LAB_00362aaa;
        }
      }
LAB_00362aaa:
      if ((int)*__ptr < (int)uVar16) {
        if (*(void **)(__ptr + 2) == (void *)0x0) {
          pvVar5 = malloc((long)(int)uVar16 << 2);
        }
        else {
          pvVar5 = realloc(*(void **)(__ptr + 2),(long)(int)uVar16 << 2);
        }
        *(void **)(__ptr + 2) = pvVar5;
        if (pvVar5 == (void *)0x0) goto LAB_00362eb0;
        *__ptr = uVar16;
      }
      if (uVar11 < 0x7fffffff) {
        memset(*(void **)(__ptr + 2),0xff,uVar17 << 2);
      }
      __ptr[1] = uVar16;
      if (0 < p_00->nSize) {
        piVar6 = p_00->pArray;
        lVar12 = 0;
        do {
          iVar9 = piVar6[lVar12];
          if (((long)iVar9 < 0) || (p->nSize <= iVar9)) goto LAB_00362e34;
          piVar1 = p->pArray + iVar9;
          if ((long)*piVar1 < 1) {
            uVar11 = 0;
          }
          else {
            uVar13 = 0;
            uVar11 = 0;
            do {
              uVar11 = uVar11 + (&Hsh_VecManHash_s_Primes)[uVar13 % 7] * piVar1[uVar13 + 2];
              uVar13 = uVar13 + 1;
            } while ((long)*piVar1 != uVar13);
          }
          uVar13 = (ulong)uVar11 % (ulong)__ptr[1];
          if (((int)uVar13 < 0) || ((int)__ptr[1] <= (int)uVar13)) goto LAB_00362e34;
          if (p_00->nSize <= lVar12) goto LAB_00362e53;
          lVar15 = *(long *)(__ptr + 2);
          piVar1[1] = *(int *)(lVar15 + uVar13 * 4);
          *(int *)(lVar15 + uVar13 * 4) = (int)lVar12;
          lVar12 = lVar12 + 1;
        } while (lVar12 < p_00->nSize);
      }
    }
    iVar9 = p_01->nSize;
    uVar13 = (ulong)iVar9;
    if ((long)uVar13 < 1) {
      uVar11 = 0;
    }
    else {
      uVar14 = 0;
      uVar11 = 0;
      do {
        uVar11 = uVar11 + (&Hsh_VecManHash_s_Primes)[uVar14 % 7] * p_01->pArray[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
    }
    uVar14 = (ulong)uVar11 % (ulong)__ptr[1];
    iVar4 = (int)uVar14;
    if ((iVar4 < 0) || ((int)__ptr[1] <= iVar4)) {
LAB_00362e34:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    puVar7 = (uint *)(uVar14 * 4 + *(long *)(__ptr + 2));
LAB_00362c2a:
    uVar11 = *puVar7;
    if ((ulong)uVar11 == 0xffffffff) {
      piVar6 = (int *)0x0;
    }
    else {
      if (((int)uVar11 < 0) || (p_00->nSize <= (int)uVar11)) {
LAB_00362e53:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = p_00->pArray[uVar11];
      if (((long)iVar4 < 0) || (p->nSize <= iVar4)) goto LAB_00362e34;
      piVar6 = p->pArray + iVar4;
    }
    if (piVar6 != (int *)0x0) {
      if ((*piVar6 == iVar9) &&
         (iVar4 = bcmp(piVar6 + 2,p_01->pArray,(long)*piVar6 << 2), iVar4 == 0)) goto LAB_00362d3d;
      puVar7 = (uint *)(piVar6 + 1);
      goto LAB_00362c2a;
    }
    *puVar7 = p_00->nSize;
    if ((p->nSize & 1U) != 0) {
      __assert_fail("Vec_IntSize(p->vData) % 2 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecHsh.h"
                    ,0x216,"int Hsh_VecManAdd(Hsh_VecMan_t *, Vec_Int_t *)");
    }
    Vec_IntPush(p_00,p->nSize);
    Vec_IntPush(p,iVar9);
    Vec_IntPush(p,-1);
    if (0 < iVar9) {
      piVar6 = p_01->pArray;
      uVar14 = 0;
      do {
        Vec_IntPush(p,piVar6[uVar14]);
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
    }
    if ((uVar13 & 1) != 0) {
      Vec_IntPush(p,-1);
    }
    uVar11 = p_00->nSize - 1;
LAB_00362d3d:
    if ((iVar8 < 0) || (vClasses->nSize <= iVar8)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    vClasses->pArray[iVar8] = uVar11;
    lVar10 = lVar10 + 1;
    if ((pNtk->vFfs).nSize <= lVar10) goto LAB_00362d7c;
  } while( true );
}

Assistant:

int Wln_RetComputeFfClasses( Wln_Ntk_t * pNtk, Vec_Int_t * vClasses )
{
    int i, k, iObj, nClasses;
    Hsh_VecMan_t * p = Hsh_VecManStart( 10 );
    Vec_Int_t * vFlop = Vec_IntAlloc( 6 ); 
    Vec_IntFill( vClasses, Wln_NtkObjNum(pNtk), -1 );
    Wln_NtkForEachFf( pNtk, iObj, i )
    {
        Vec_IntClear( vFlop );
        for ( k = 1; k <= 6; k++ )
            Vec_IntPush( vFlop, Wln_ObjFanin(pNtk, iObj, k) );
        Vec_IntWriteEntry( vClasses, iObj, Hsh_VecManAdd(p, vFlop) );
    }
    nClasses = Hsh_VecSize( p );
    Hsh_VecManStop( p );
    Vec_IntFree( vFlop );
    printf( "Detected %d flops and %d flop classes.\n", Wln_NtkFfNum(pNtk), nClasses );
    return nClasses;
}